

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O0

void __thiscall YAML::SingleDocParser::HandleNode(SingleDocParser *this,EventHandler *eventHandler)

{
  bool bVar1;
  int iVar2;
  value vVar3;
  Token *pTVar4;
  Token *name;
  anchor_t aVar5;
  ulong uVar6;
  long *in_RSI;
  Mark MVar7;
  Token *token;
  anchor_t anchor;
  string anchor_name;
  string tag;
  Mark mark;
  DepthGuard<500> depthguard;
  CollectionStack *in_stack_fffffffffffffdf8;
  Scanner *in_stack_fffffffffffffe00;
  string *in_stack_fffffffffffffe08;
  allocator *paVar8;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  string *in_stack_fffffffffffffe18;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  int *in_stack_fffffffffffffe28;
  char *pcVar9;
  DepthGuard<500> *in_stack_fffffffffffffe30;
  SingleDocParser *in_stack_fffffffffffffe70;
  long *plVar10;
  allocator local_131;
  string local_130 [32];
  Token *local_110;
  undefined8 local_108;
  string local_100 [32];
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [32];
  undefined8 local_98;
  int local_90;
  undefined4 local_8c;
  Mark local_88;
  Mark local_78 [2];
  allocator local_59;
  string local_58 [32];
  Mark local_38;
  undefined8 local_28;
  int local_20;
  DepthGuard<500> local_18;
  long *local_10;
  
  local_10 = in_RSI;
  MVar7 = Scanner::mark((Scanner *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  local_38.column = MVar7.column;
  local_20 = local_38.column;
  local_38._0_8_ = MVar7._0_8_;
  local_28._0_4_ = local_38.pos;
  local_28._4_4_ = local_38.line;
  local_38 = MVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"bad file",&local_59);
  DepthGuard<500>::DepthGuard
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
             (Mark *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
             in_stack_fffffffffffffe18);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  bVar1 = Scanner::empty(in_stack_fffffffffffffe00);
  if (bVar1) {
    local_88 = Scanner::mark((Scanner *)
                             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    local_78[0] = local_88;
    (**(code **)(*local_10 + 0x20))(local_10,local_78,0);
    local_8c = 1;
    goto LAB_00f25836;
  }
  pTVar4 = Scanner::peek(in_stack_fffffffffffffe00);
  local_90 = (pTVar4->mark).column;
  local_98._0_4_ = (pTVar4->mark).pos;
  local_98._4_4_ = (pTVar4->mark).line;
  pTVar4 = Scanner::peek(in_stack_fffffffffffffe00);
  if (pTVar4->type == VALUE) {
    plVar10 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"?",&local_b9);
    (**(code **)(*plVar10 + 0x48))(plVar10,&local_98,local_b8,0);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    HandleMap((SingleDocParser *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
              (EventHandler *)in_stack_fffffffffffffe08);
    (**(code **)(*local_10 + 0x50))();
    local_8c = 1;
    goto LAB_00f25836;
  }
  pTVar4 = Scanner::peek(in_stack_fffffffffffffe00);
  if (pTVar4->type == ALIAS) {
    name = Scanner::peek(in_stack_fffffffffffffe00);
    aVar5 = LookupAnchor(in_stack_fffffffffffffe70,(Mark *)pTVar4,(string *)name);
    (**(code **)(*local_10 + 0x28))(local_10,&local_98,aVar5);
    Scanner::pop(in_stack_fffffffffffffe00);
    local_8c = 1;
    goto LAB_00f25836;
  }
  std::__cxx11::string::string(local_e0);
  std::__cxx11::string::string(local_100);
  ParseProperties((SingleDocParser *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                  in_stack_fffffffffffffe18,
                  (anchor_t *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                  in_stack_fffffffffffffe08);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    (**(code **)(*local_10 + 0x58))(local_10,&local_98,local_100);
  }
  bVar1 = Scanner::empty(in_stack_fffffffffffffe00);
  if (bVar1) {
    (**(code **)(*local_10 + 0x20))(local_10,&local_98,local_108);
    local_8c = 1;
  }
  else {
    local_110 = Scanner::peek(in_stack_fffffffffffffe00);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) != 0) {
      if (local_110->type == NON_PLAIN_SCALAR) {
        pcVar9 = "!";
      }
      else {
        pcVar9 = "?";
      }
      std::__cxx11::string::operator=(local_e0,pcVar9);
    }
    if (((local_110->type == PLAIN_SCALAR) &&
        (iVar2 = std::__cxx11::string::compare((char *)local_e0), iVar2 == 0)) &&
       (bVar1 = IsNullString((string *)in_stack_fffffffffffffe00), bVar1)) {
      (**(code **)(*local_10 + 0x20))(local_10,&local_98,local_108);
      Scanner::pop(in_stack_fffffffffffffe00);
      local_8c = 1;
    }
    else {
      switch(local_110->type) {
      case BLOCK_SEQ_START:
        (**(code **)(*local_10 + 0x38))(local_10,&local_98,local_e0,local_108,1);
        HandleSequence((SingleDocParser *)
                       CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                       (EventHandler *)in_stack_fffffffffffffe08);
        (**(code **)(*local_10 + 0x40))();
        local_8c = 1;
        break;
      case BLOCK_MAP_START:
        (**(code **)(*local_10 + 0x48))(local_10,&local_98,local_e0,local_108,1);
        HandleMap((SingleDocParser *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                  (EventHandler *)in_stack_fffffffffffffe08);
        (**(code **)(*local_10 + 0x50))();
        local_8c = 1;
        break;
      default:
LAB_00f256f1:
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8);
        if (bVar1) {
          (**(code **)(*local_10 + 0x20))(local_10,&local_98,local_108);
        }
        else {
          paVar8 = &local_131;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_130,"",paVar8);
          (**(code **)(*local_10 + 0x30))(local_10,&local_98,local_e0,local_108,local_130);
          std::__cxx11::string::~string(local_130);
          std::allocator<char>::~allocator((allocator<char> *)&local_131);
        }
        local_8c = 0;
        break;
      case FLOW_SEQ_START:
        (**(code **)(*local_10 + 0x38))(local_10,&local_98,local_e0,local_108,2);
        HandleSequence((SingleDocParser *)
                       CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                       (EventHandler *)in_stack_fffffffffffffe08);
        (**(code **)(*local_10 + 0x40))();
        local_8c = 1;
        break;
      case FLOW_MAP_START:
        (**(code **)(*local_10 + 0x48))(local_10,&local_98,local_e0,local_108,2);
        HandleMap((SingleDocParser *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                  (EventHandler *)in_stack_fffffffffffffe08);
        (**(code **)(*local_10 + 0x50))();
        local_8c = 1;
        break;
      case KEY:
        std::unique_ptr<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>::
        operator->((unique_ptr<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_> *
                   )0xf2566b);
        vVar3 = CollectionStack::GetCurCollectionType(in_stack_fffffffffffffdf8);
        if (vVar3 != FlowSeq) goto LAB_00f256f1;
        (**(code **)(*local_10 + 0x48))(local_10,&local_98,local_e0,local_108,2);
        HandleMap((SingleDocParser *)CONCAT44(vVar3,in_stack_fffffffffffffe10),
                  (EventHandler *)in_stack_fffffffffffffe08);
        (**(code **)(*local_10 + 0x50))();
        local_8c = 1;
        break;
      case PLAIN_SCALAR:
      case NON_PLAIN_SCALAR:
        (**(code **)(*local_10 + 0x30))(local_10,&local_98,local_e0,local_108,&local_110->value);
        Scanner::pop(in_stack_fffffffffffffe00);
        local_8c = 1;
      }
    }
  }
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string(local_e0);
LAB_00f25836:
  DepthGuard<500>::~DepthGuard(&local_18);
  return;
}

Assistant:

void SingleDocParser::HandleNode(EventHandler& eventHandler) {
  DepthGuard<500> depthguard(depth, m_scanner.mark(), ErrorMsg::BAD_FILE);

  // an empty node *is* a possibility
  if (m_scanner.empty()) {
    eventHandler.OnNull(m_scanner.mark(), NullAnchor);
    return;
  }

  // save location
  Mark mark = m_scanner.peek().mark;

  // special case: a value node by itself must be a map, with no header
  if (m_scanner.peek().type == Token::VALUE) {
    eventHandler.OnMapStart(mark, "?", NullAnchor, EmitterStyle::Default);
    HandleMap(eventHandler);
    eventHandler.OnMapEnd();
    return;
  }

  // special case: an alias node
  if (m_scanner.peek().type == Token::ALIAS) {
    eventHandler.OnAlias(mark, LookupAnchor(mark, m_scanner.peek().value));
    m_scanner.pop();
    return;
  }

  std::string tag;
  std::string anchor_name;
  anchor_t anchor;
  ParseProperties(tag, anchor, anchor_name);

  if (!anchor_name.empty())
    eventHandler.OnAnchor(mark, anchor_name);

  // after parsing properties, an empty node is again a possibility
  if (m_scanner.empty()) {
    eventHandler.OnNull(mark, anchor);
    return;
  }

  const Token& token = m_scanner.peek();

  // add non-specific tags
  if (tag.empty())
    tag = (token.type == Token::NON_PLAIN_SCALAR ? "!" : "?");
  
  if (token.type == Token::PLAIN_SCALAR 
      && tag.compare("?") == 0 && IsNullString(token.value)) {
    eventHandler.OnNull(mark, anchor);
    m_scanner.pop();
    return;
  }

  // now split based on what kind of node we should be
  switch (token.type) {
    case Token::PLAIN_SCALAR:
    case Token::NON_PLAIN_SCALAR:
      eventHandler.OnScalar(mark, tag, anchor, token.value);
      m_scanner.pop();
      return;
    case Token::FLOW_SEQ_START:
      eventHandler.OnSequenceStart(mark, tag, anchor, EmitterStyle::Flow);
      HandleSequence(eventHandler);
      eventHandler.OnSequenceEnd();
      return;
    case Token::BLOCK_SEQ_START:
      eventHandler.OnSequenceStart(mark, tag, anchor, EmitterStyle::Block);
      HandleSequence(eventHandler);
      eventHandler.OnSequenceEnd();
      return;
    case Token::FLOW_MAP_START:
      eventHandler.OnMapStart(mark, tag, anchor, EmitterStyle::Flow);
      HandleMap(eventHandler);
      eventHandler.OnMapEnd();
      return;
    case Token::BLOCK_MAP_START:
      eventHandler.OnMapStart(mark, tag, anchor, EmitterStyle::Block);
      HandleMap(eventHandler);
      eventHandler.OnMapEnd();
      return;
    case Token::KEY:
      // compact maps can only go in a flow sequence
      if (m_pCollectionStack->GetCurCollectionType() ==
          CollectionType::FlowSeq) {
        eventHandler.OnMapStart(mark, tag, anchor, EmitterStyle::Flow);
        HandleMap(eventHandler);
        eventHandler.OnMapEnd();
        return;
      }
      break;
    default:
      break;
  }

  if (tag == "?")
    eventHandler.OnNull(mark, anchor);
  else
    eventHandler.OnScalar(mark, tag, anchor, "");
}